

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O3

int Lodtalk::Object::stIdentityHash(InterpreterProxy *interpreter)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  uint *puVar3;
  
  uVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])();
  puVar3 = (uint *)CONCAT44(extraout_var,uVar1);
  if ((uVar1 & 1) == 0) {
    if (((uVar1 & 6) == 4) || ((uVar1 & 6) == 2)) {
      uVar1 = (uint)((ulong)puVar3 >> 3);
    }
    else {
      uVar1 = *puVar3 >> 10;
    }
  }
  else {
    uVar1 = (uint)((ulong)puVar3 >> 1);
  }
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x15])(interpreter,(long)(int)uVar1);
  return iVar2;
}

Assistant:

int Object::stIdentityHash(InterpreterProxy *interpreter)
{
    auto receiver = interpreter->getReceiver();
    return interpreter->returnSmallInteger(identityHashOf(receiver));
}